

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

filemgr_dirty_update_node * filemgr_dirty_update_new_node(filemgr *file)

{
  filemgr_dirty_update_node *atomic_val;
  uint64_t uVar1;
  long in_RDI;
  filemgr_dirty_update_node *node;
  avl_tree *in_stack_00000018;
  memory_order in_stack_ffffffffffffffec;
  
  atomic_val = (filemgr_dirty_update_node *)calloc(1,0x50);
  uVar1 = atomic_incr_uint64_t((atomic<unsigned_long> *)atomic_val,in_stack_ffffffffffffffec);
  atomic_val->id = uVar1;
  atomic_val->immutable = false;
  atomic_val->expired = false;
  atomic_init_uint32_t((atomic<unsigned_int> *)atomic_val,in_stack_ffffffffffffffec);
  atomic_val->seqtree_root = 0xffffffffffffffff;
  atomic_val->idtree_root = 0xffffffffffffffff;
  avl_init(&atomic_val->dirty_blocks,(void *)0x0);
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x2d0));
  avl_insert(in_stack_00000018,(avl_node *)file,(avl_cmp_func *)node);
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x2d0));
  return atomic_val;
}

Assistant:

struct filemgr_dirty_update_node *filemgr_dirty_update_new_node(struct filemgr *file)
{
    struct filemgr_dirty_update_node *node;

    node = (struct filemgr_dirty_update_node *)
           calloc(1, sizeof(struct filemgr_dirty_update_node));
    node->id = atomic_incr_uint64_t(&file->dirty_update_counter);
    node->immutable = false; // currently being written
    node->expired = false;
    atomic_init_uint32_t(&node->ref_count, 0);
    node->idtree_root = node->seqtree_root = BLK_NOT_FOUND;
    avl_init(&node->dirty_blocks, NULL);

    spin_lock(&file->dirty_update_lock);
    avl_insert(&file->dirty_update_idx, &node->avl, _dirty_update_idx_cmp);
    spin_unlock(&file->dirty_update_lock);

    return node;
}